

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char_const*,char[19],char_const*,char[25],std::__cxx11::string,char[30],std::__cxx11::string,char[134]>
          (string *__return_storage_ptr__,Diligent *this,char **Args,char (*Args_1) [19],
          char **Args_2,char (*Args_3) [25],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_4,
          char (*Args_5) [30],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_6,
          char (*Args_7) [134])

{
  stringstream ss;
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  FormatStrSS<std::__cxx11::stringstream,char_const*>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
             (char **)this);
  FormatStrSS<std::__cxx11::stringstream,char[19],char_const*,char[25],std::__cxx11::string,char[30],std::__cxx11::string,char[134]>
            (&ss,(char (*) [19])Args,(char **)Args_1,(char (*) [25])Args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_3,
             (char (*) [30])Args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_5,
             (char (*) [134])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}